

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_ident(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *cclass;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cclass_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cclass_01;
  char *extraout_RDX_03;
  char *cclass_02;
  char *extraout_RDX_04;
  char *cclass_03;
  char *cclass_04;
  char *extraout_RDX_05;
  char *cclass_05;
  char *cclass_06;
  char *extraout_RDX_06;
  int iVar4;
  code *action;
  char *pcVar5;
  int iVar6;
  int yypos842;
  
  iVar4 = G->pos;
  iVar6 = G->thunkpos;
  yyText(G,G->begin,G->end);
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  G->begin = iVar3;
  iVar2 = yymatchString(G,"::");
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
  }
  iVar3 = yymatchClass(G,(uchar *)"",cclass);
  pcVar5 = extraout_RDX;
  if (iVar3 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar6;
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar3 = yymatchClass(G,(uchar *)"",cclass_02);
    pcVar5 = extraout_RDX_04;
    if (iVar3 == 0) {
      G->pos = iVar4;
      G->thunkpos = iVar6;
      return 0;
    }
    do {
      iVar4 = G->pos;
      iVar6 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
      pcVar5 = cclass_03;
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar6;
    iVar3 = yymatchClass(G,(uchar *)"",cclass_03);
    if (iVar3 != 0) {
      iVar3 = yymatchClass(G,(uchar *)"",cclass_04);
      pcVar5 = extraout_RDX_05;
      while (iVar3 != 0) {
        do {
          iVar4 = G->pos;
          iVar6 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
          pcVar5 = cclass_05;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar6;
        iVar3 = yymatchClass(G,(uchar *)"",cclass_05);
        if (iVar3 == 0) break;
        iVar3 = yymatchClass(G,(uchar *)"",cclass_06);
        pcVar5 = extraout_RDX_06;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar6;
    yyText(G,G->begin,G->end);
    iVar4 = G->pos;
    iVar6 = G->begin;
    G->end = iVar4;
    action = yy_2_ident;
    pcVar5 = "yy_2_ident";
  }
  else {
    do {
      iVar4 = G->pos;
      iVar6 = G->thunkpos;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
      pcVar5 = extraout_RDX_00;
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar6;
    iVar3 = yymatchString(G,"::");
    if (iVar3 != 0) {
      iVar3 = yymatchClass(G,(uchar *)"",cclass_00);
      pcVar5 = extraout_RDX_01;
      while (iVar3 != 0) {
        do {
          iVar4 = G->pos;
          iVar6 = G->thunkpos;
          iVar3 = yymatchClass(G,(uchar *)"",pcVar5);
          pcVar5 = extraout_RDX_02;
        } while (iVar3 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar6;
        iVar3 = yymatchString(G,"::");
        if (iVar3 == 0) break;
        iVar3 = yymatchClass(G,(uchar *)"",cclass_01);
        pcVar5 = extraout_RDX_03;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar6;
    yyText(G,G->begin,G->end);
    iVar4 = G->pos;
    iVar6 = G->begin;
    G->end = iVar4;
    action = yy_1_ident;
    pcVar5 = "yy_1_ident";
  }
  yyDo(G,action,iVar6,iVar4,pcVar5);
  return 1;
}

Assistant:

YY_RULE(int) yy_ident(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "ident"));

  {  int yypos840= G->pos, yythunkpos840= G->thunkpos;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l841;
  {  int yypos842= G->pos, yythunkpos842= G->thunkpos;  if (!yymatchString(G, "::")) goto l842;
  goto l843;
  l842:;	  G->pos= yypos842; G->thunkpos= yythunkpos842;
  }
  l843:;	  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l841;

  l844:;	
  {  int yypos845= G->pos, yythunkpos845= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-A-Za-z0-9_")) goto l845;
  goto l844;
  l845:;	  G->pos= yypos845; G->thunkpos= yythunkpos845;
  }
  l846:;	
  {  int yypos847= G->pos, yythunkpos847= G->thunkpos;  if (!yymatchString(G, "::")) goto l847;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l847;

  l848:;	
  {  int yypos849= G->pos, yythunkpos849= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z0-9_")) goto l849;
  goto l848;
  l849:;	  G->pos= yypos849; G->thunkpos= yythunkpos849;
  }  goto l846;
  l847:;	  G->pos= yypos847; G->thunkpos= yythunkpos847;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l841;  yyDo(G, yy_1_ident, G->begin, G->end, "yy_1_ident");
  goto l840;
  l841:;	  G->pos= yypos840; G->thunkpos= yythunkpos840;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l839;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z")) goto l839;

  l850:;	
  {  int yypos851= G->pos, yythunkpos851= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l851;
  goto l850;
  l851:;	  G->pos= yypos851; G->thunkpos= yythunkpos851;
  }
  l852:;	
  {  int yypos853= G->pos, yythunkpos853= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\000\000\000\000\000\200\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-_")) goto l853;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l853;

  l854:;	
  {  int yypos855= G->pos, yythunkpos855= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-zA-Z0-9")) goto l855;
  goto l854;
  l855:;	  G->pos= yypos855; G->thunkpos= yythunkpos855;
  }  goto l852;
  l853:;	  G->pos= yypos853; G->thunkpos= yythunkpos853;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l839;  yyDo(G, yy_2_ident, G->begin, G->end, "yy_2_ident");

  }
  l840:;	  yyprintf((stderr, "  ok   ident"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l839:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "ident"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}